

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int jx9Builtin_zip_entry_compressionmethod(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  long lVar1;
  int nLen;
  char *zString;
  jx9_value *pjVar2;
  
  if ((((nArg < 1) || (((*apArg)->iFlags & 0x100) == 0)) || (lVar1 = ((*apArg)->x).iVal, lVar1 == 0)
      ) || (*(int *)(lVar1 + 0xa0) != -0x21529ca6)) {
    jx9VmThrowError(pCtx->pVm,&pCtx->pFunc->sName,1,"Expecting a ZIP archive entry");
    pjVar2 = pCtx->pRet;
    jx9MemObjRelease(pjVar2);
    (pjVar2->x).rVal = 0.0;
    pjVar2->iFlags = pjVar2->iFlags & 0xfffffe90U | 8;
    return 0;
  }
  switch(*(undefined2 *)(lVar1 + 0x4c)) {
  case 0:
    pjVar2 = pCtx->pRet;
    zString = "stored";
    goto LAB_0013d30e;
  case 1:
    pjVar2 = pCtx->pRet;
    zString = "shrunk";
LAB_0013d30e:
    nLen = 6;
    goto LAB_0013d313;
  case 2:
  case 3:
  case 4:
  case 5:
    pjVar2 = pCtx->pRet;
    zString = "reduced";
    break;
  case 6:
    pjVar2 = pCtx->pRet;
    zString = "implode";
    break;
  default:
    pjVar2 = pCtx->pRet;
    zString = "unknown";
    break;
  case 8:
    pjVar2 = pCtx->pRet;
    zString = "deflate";
  }
  nLen = 7;
LAB_0013d313:
  jx9_value_string(pjVar2,zString,nLen);
  return 0;
}

Assistant:

static int jx9Builtin_zip_entry_compressionmethod(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	SyArchiveEntry *pEntry;
	if( nArg < 1 || !jx9_value_is_resource(apArg[0]) ){
		/* Missing/Invalid arguments */
		jx9_context_throw_error(pCtx, JX9_CTX_ERR, "Expecting a ZIP archive entry");
		/* return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Make sure we are dealing with a valid ZIP archive entry */
	pEntry = (SyArchiveEntry *)jx9_value_to_resource(apArg[0]);
	if( SXARCH_ENTRY_INVALID(pEntry) ){
		jx9_context_throw_error(pCtx, JX9_CTX_ERR, "Expecting a ZIP archive entry");
		/* return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	switch(pEntry->nComprMeth){
	case 0:
		/* No compression;entry is stored */
		jx9_result_string(pCtx, "stored", (int)sizeof("stored")-1);
		break;
	case 8:
		/* Entry is deflated (Default compression algorithm)  */
		jx9_result_string(pCtx, "deflate", (int)sizeof("deflate")-1);
		break;
		/* Exotic compression algorithms */ 
	case 1:
		jx9_result_string(pCtx, "shrunk", (int)sizeof("shrunk")-1);
		break;
	case 2:
	case 3:
	case 4:
	case 5:
		/* Entry is reduced */
		jx9_result_string(pCtx, "reduced", (int)sizeof("reduced")-1);
		break;
	case 6:
		/* Entry is imploded */
		jx9_result_string(pCtx, "implode", (int)sizeof("implode")-1);
		break;
	default:
		jx9_result_string(pCtx, "unknown", (int)sizeof("unknown")-1);
		break;
	}
	return JX9_OK;
}